

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

bool __thiscall EthUdpPort::Init(EthUdpPort *this)

{
  bool bVar1;
  uint uVar2;
  bool ret;
  EthUdpPort *this_local;
  
  bVar1 = SocketInternals::Open(this->sockPtr,&this->ServerIP,&this->MulticastIP,this->UDP_port);
  if (bVar1) {
    uVar2 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[3])();
    this_local._7_1_ = (bool)((byte)uVar2 & 1);
    if (((uVar2 & 1) != 0) &&
       (BasePort::SetDefaultProtocol((BasePort *)this),
       ((this->super_EthBasePort).useFwBridge & 1U) != 0)) {
      EthBasePort::OptimizeFirewireGapCount(&this->super_EthBasePort);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EthUdpPort::Init(void)
{
    if (!sockPtr->Open(ServerIP, MulticastIP, UDP_port))
        return false;

    bool ret = ScanNodes();

    if (ret) {
        SetDefaultProtocol();
        if (useFwBridge)
            OptimizeFirewireGapCount();
    }

    //if (!ret)
    //    sockPtr->Close();
    return ret;
}